

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall amrex::MLMG::actualBottomSolve(MLMG *this)

{
  bool bVar1;
  byte bVar2;
  Any *pAVar3;
  double *pdVar4;
  long in_RDI;
  double dVar5;
  Vector<double,_std::allocator<double>_> *this_00;
  int i_1;
  int n;
  int ret;
  Type cg_type;
  IntVect ng;
  Any raii_b;
  Any *bottom_b;
  int i;
  bool skip_fillboundary;
  Any *b;
  Any *x;
  int mglev;
  int amrlev;
  double bottom_start_time;
  Type in_stack_0000011c;
  Any *in_stack_00000120;
  int in_stack_00000128;
  int in_stack_0000012c;
  MLMG *in_stack_00000130;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  MLLinOp *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar6;
  Any *in_stack_ffffffffffffff30;
  long *plVar7;
  int local_80;
  int local_78;
  undefined1 local_70 [8];
  undefined1 local_68 [12];
  undefined1 local_58 [2] [12];
  Any local_40;
  Any *local_38;
  int local_30;
  undefined1 local_29;
  Any *local_28;
  Any *local_20;
  int local_18;
  undefined4 local_14;
  double local_10;
  
  bVar1 = MLLinOp::isBottomActive(*(MLLinOp **)(in_RDI + 0x48));
  if (bVar1) {
    local_10 = second();
    MLLinOp::BottomCommunicator(*(MLLinOp **)(in_RDI + 0x48));
    ParallelContext::push(0);
    local_14 = 0;
    local_18 = MLLinOp::NMGLevels(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    local_18 = local_18 + -1;
    Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  *)in_stack_ffffffffffffff20,
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_20 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_ffffffffffffff20,
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  *)in_stack_ffffffffffffff20,
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_28 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                         ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                          in_stack_ffffffffffffff20,
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    (**(code **)(**(long **)(in_RDI + 0x48) + 0x170))(*(long **)(in_RDI + 0x48),local_20);
    if (*(int *)(in_RDI + 0x20) == 1) {
      local_29 = 1;
      local_30 = 0;
      while( true ) {
        if (*(int *)(in_RDI + 0x14) <= local_30) break;
        (**(code **)(**(long **)(in_RDI + 0x48) + 0x1c8))
                  (*(long **)(in_RDI + 0x48),0,local_18,local_20,local_28,local_29);
        local_29 = 0;
        local_30 = local_30 + 1;
      }
    }
    else {
      local_38 = local_28;
      Any::Any(in_stack_ffffffffffffff30);
      bVar2 = (**(code **)(**(long **)(in_RDI + 0x48) + 0xf8))();
      if ((bVar2 & 1) != 0) {
        bVar1 = MLLinOp::getEnforceSingularSolvable(*(MLLinOp **)(in_RDI + 0x48));
        if (bVar1) {
          local_68 = (**(code **)(**(long **)(in_RDI + 0x48) + 0x158))
                               (*(long **)(in_RDI + 0x48),local_28);
          local_58[0] = local_68;
          (**(code **)(**(long **)(in_RDI + 0x48) + 0x138))
                    (local_70,*(long **)(in_RDI + 0x48),0,local_18,local_58);
          Any::operator=((Any *)in_stack_ffffffffffffff20,
                         (Any *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          Any::~Any((Any *)0x125c2c4);
          (**(code **)(**(long **)(in_RDI + 0x48) + 0x160))
                    (*(long **)(in_RDI + 0x48),&local_40,local_28,local_58);
          local_38 = &local_40;
          makeSolvable(in_stack_00000130,in_stack_0000012c,in_stack_00000128,in_stack_00000120);
        }
      }
      if (*(int *)(in_RDI + 0x20) != 6) {
        if (*(int *)(in_RDI + 0x20) == 7) {
          bottomSolveWithPETSc
                    ((MLMG *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     (Any *)in_stack_ffffffffffffff20,
                     (Any *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        }
        else {
          local_78 = bottomSolveWithCG(in_stack_00000130,
                                       (Any *)CONCAT44(in_stack_0000012c,in_stack_00000128),
                                       in_stack_00000120,in_stack_0000011c);
          if (local_78 != 0) {
            plVar7 = *(long **)(in_RDI + 0x48);
            Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
            ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                          *)in_stack_ffffffffffffff20,
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
            pAVar3 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                               ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                                in_stack_ffffffffffffff20,
                                CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
            (**(code **)(*plVar7 + 0x170))(plVar7,pAVar3);
            if ((*(int *)(in_RDI + 0x20) == 5) || (*(int *)(in_RDI + 0x20) == 4)) {
              iVar6 = *(int *)(in_RDI + 0x20);
              local_78 = bottomSolveWithCG(in_stack_00000130,
                                           (Any *)CONCAT44(in_stack_0000012c,in_stack_00000128),
                                           in_stack_00000120,in_stack_0000011c);
              if (local_78 == 0) {
                if (iVar6 == 5) {
                  *(undefined4 *)(in_RDI + 0x20) = 2;
                }
                else {
                  *(undefined4 *)(in_RDI + 0x20) = 3;
                }
              }
              else {
                plVar7 = *(long **)(in_RDI + 0x48);
                Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                ::operator[]((Vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                              *)in_stack_ffffffffffffff20,
                             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
                pAVar3 = Vector<amrex::Any,_std::allocator<amrex::Any>_>::operator[]
                                   ((Vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                                    in_stack_ffffffffffffff20,
                                    CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
                (**(code **)(*plVar7 + 0x170))(plVar7,pAVar3);
              }
            }
          }
          if (local_78 == 0) {
            iVar6 = *(int *)(in_RDI + 0x18);
          }
          else {
            iVar6 = *(int *)(in_RDI + 0x14);
          }
          for (local_80 = 0; local_80 < iVar6; local_80 = local_80 + 1) {
            (**(code **)(**(long **)(in_RDI + 0x48) + 0x1c8))
                      (*(long **)(in_RDI + 0x48),0,local_18,local_20,local_28);
          }
        }
      }
      Any::~Any((Any *)0x125c58a);
    }
    ParallelContext::pop();
    dVar5 = second();
    this_00 = (Vector<double,_std::allocator<double>_> *)(dVar5 - local_10);
    pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                       (this_00,CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    *pdVar4 = (double)this_00 + *pdVar4;
  }
  return;
}

Assistant:

void
MLMG::actualBottomSolve ()
{
    BL_PROFILE("MLMG::actualBottomSolve()");

    if (!linop.isBottomActive()) return;

    auto bottom_start_time = amrex::second();

    ParallelContext::push(linop.BottomCommunicator());

    const int amrlev = 0;
    const int mglev = linop.NMGLevels(amrlev) - 1;
    auto& x = cor[amrlev][mglev];
    auto& b = res[amrlev][mglev];

    linop.AnySetToZero(x);

    if (bottom_solver == BottomSolver::smoother)
    {
        bool skip_fillboundary = true;
        for (int i = 0; i < nuf; ++i) {
            linop.AnySmooth(amrlev, mglev, x, b, skip_fillboundary);
            skip_fillboundary = false;
        }
    }
    else
    {
        Any* bottom_b = &b;
        Any raii_b;
        if (linop.isBottomSingular() && linop.getEnforceSingularSolvable())
        {
            const IntVect ng = linop.AnyGrowVect(b);
            raii_b = linop.AnyMake(amrlev, mglev, ng);
            linop.AnyCopy(raii_b, b, ng);
            bottom_b = &raii_b;

            makeSolvable(amrlev,mglev,*bottom_b);
        }

        if (bottom_solver == BottomSolver::hypre)
        {
#if defined(AMREX_USE_HYPRE) && (AMREX_SPACEDIM > 1)
            bottomSolveWithHypre(x, *bottom_b);
#endif
        }
        else if (bottom_solver == BottomSolver::petsc)
        {
            bottomSolveWithPETSc(x, *bottom_b);
        }
        else
        {
            MLCGSolver::Type cg_type;
            if (bottom_solver == BottomSolver::cg ||
                bottom_solver == BottomSolver::cgbicg) {
                cg_type = MLCGSolver::Type::CG;
            } else {
                cg_type = MLCGSolver::Type::BiCGStab;
            }
            int ret = bottomSolveWithCG(x, *bottom_b, cg_type);
            // If the MLMG solve failed then set the correction to zero
            if (ret != 0) {
                linop.AnySetToZero(cor[amrlev][mglev]);
                if (bottom_solver == BottomSolver::cgbicg ||
                    bottom_solver == BottomSolver::bicgcg) {
                    if (bottom_solver == BottomSolver::cgbicg) {
                        cg_type = MLCGSolver::Type::BiCGStab; // switch to bicg
                    } else {
                        cg_type = MLCGSolver::Type::CG; // switch to cg
                    }
                    ret = bottomSolveWithCG(x, *bottom_b, cg_type);
                    if (ret != 0) {
                        linop.AnySetToZero(cor[amrlev][mglev]);
                    } else { // switch permanently
                        if (cg_type == MLCGSolver::Type::CG) {
                            bottom_solver = BottomSolver::cg;
                        } else {
                            bottom_solver = BottomSolver::bicgstab;
                        }
                    }
                }
            }
            const int n = (ret==0) ? nub : nuf;
            for (int i = 0; i < n; ++i) {
                linop.AnySmooth(amrlev, mglev, x, b);
            }
        }
    }

    ParallelContext::pop();

    timer[bottom_time] += amrex::second() - bottom_start_time;
}